

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O3

void __thiscall Assimp::LWO::Surface::~Surface(Surface *this)

{
  pointer pcVar1;
  
  std::__cxx11::_List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::_M_clear
            (&(this->mReflectionTextures).
              super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>);
  std::__cxx11::_List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::_M_clear
            (&(this->mGlossinessTextures).
              super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>);
  std::__cxx11::_List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::_M_clear
            (&(this->mBumpTextures).
              super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>);
  std::__cxx11::_List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::_M_clear
            (&(this->mOpacityTextures).
              super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>);
  std::__cxx11::_List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::_M_clear
            (&(this->mSpecularTextures).
              super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>);
  std::__cxx11::_List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::_M_clear
            (&(this->mDiffuseTextures).
              super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>);
  std::__cxx11::_List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::_M_clear
            (&(this->mColorTextures).
              super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>);
  std::__cxx11::_List_base<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_>::_M_clear
            (&(this->mShaders).
              super__List_base<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_>);
  pcVar1 = (this->mVCMap)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mVCMap).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->mName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->mName).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Surface()
        : mColor                (0.78431f,0.78431f,0.78431f)
        , bDoubleSided          (false)
        , mDiffuseValue         (1.f)
        , mSpecularValue        (0.f)
        , mTransparency         (0.f)
        , mGlossiness           (0.4f)
        , mLuminosity           (0.f)
        , mColorHighlights      (0.f)
        , mMaximumSmoothAngle   (0.f) // 0 == not specified, no smoothing
        , mVCMap                ("")
        , mVCMapType            (AI_LWO_RGBA)
        , mIOR                  (1.f) // vakuum
        , mBumpIntensity        (1.f)
        , mWireframe            (false)
        , mAdditiveTransparency (0.f)
    {}